

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonComment(void *user_data,xmlChar *value)

{
  int iVar1;
  PyObject *op;
  long lVar2;
  PyObject *result;
  PyObject *handler;
  xmlChar *value_local;
  void *user_data_local;
  
  iVar1 = PyObject_HasAttrString(user_data,"comment");
  if (iVar1 != 0) {
    op = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"comment","s",value);
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(op);
  }
  return;
}

Assistant:

static void
pythonComment(void *user_data, const xmlChar * value)
{
    PyObject *handler;
    PyObject *result;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "comment")) {
        result =
            PyObject_CallMethod(handler, (char *) "comment", (char *) "s",
                                value);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}